

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalWrenchesEstimation.cpp
# Opt level: O2

Wrench * iDynTree::computeKnownTermsOfEstimationEquationWithoutInternalFT
                   (Wrench *__return_storage_ptr__,Model *model,Traversal *modelTraversal,
                   JointPosDoubleArray *jointPos,LinkVelArray *linkVel,LinkAccArray *linkProperAcc,
                   estimateExternalWrenchesBuffers *bufs)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  Twist *pTVar5;
  SpatialMomentum *pSVar6;
  Wrench *pWVar7;
  long lVar8;
  long lVar9;
  long *plVar10;
  Transform *pTVar11;
  LinkWrenches *this;
  uint uVar12;
  Transform visitedLink_X_child;
  SpatialInertia local_138 [56];
  Twist local_100 [56];
  Wrench local_c8;
  SpatialInertia local_68 [56];
  
  iVar1 = iDynTree::Traversal::getNrOfVisitedLinks();
  this = &bufs->b_contacts_subtree;
  do {
    iVar1 = iVar1 + -1;
    if (iVar1 < 0) {
      SpatialVector<iDynTree::SpatialForceVector>::Zero();
      iDynTree::Wrench::Wrench(__return_storage_ptr__,&local_c8.super_SpatialForceVector);
      iDynTree::SpatialForceVector::~SpatialForceVector(&local_c8.super_SpatialForceVector);
      return __return_storage_ptr__;
    }
    iDynTree::Traversal::getLink((long)modelTraversal);
    lVar3 = iDynTree::Link::getIndex();
    lVar4 = iDynTree::Traversal::getParentLink((long)modelTraversal);
    pTVar5 = (Twist *)iDynTree::Link::getInertia();
    iDynTree::LinkAccArray::operator()(linkProperAcc,lVar3);
    pSVar6 = (SpatialMomentum *)iDynTree::LinkVelArray::operator()(linkVel,lVar3);
    iDynTree::SpatialInertia::operator*(local_138,(SpatialAcc *)pTVar5);
    iDynTree::SpatialInertia::operator*(local_68,pTVar5);
    iDynTree::Twist::operator*(local_100,pSVar6);
    iDynTree::Wrench::operator+(&local_c8,(Wrench *)local_138);
    pWVar7 = (Wrench *)iDynTree::LinkWrenches::operator()(this,lVar3);
    iDynTree::Wrench::operator=(pWVar7,(Wrench *)&local_c8.super_SpatialForceVector);
    iDynTree::SpatialForceVector::~SpatialForceVector(&local_c8.super_SpatialForceVector);
    iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_100);
    iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_68);
    iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_138);
    for (uVar12 = 0; uVar2 = iDynTree::Model::getNrOfNeighbors((long)model), uVar12 < uVar2;
        uVar12 = uVar12 + 1) {
      lVar8 = iDynTree::Model::getNeighbor((long)model,(uint)lVar3);
      if ((lVar4 == 0) || (lVar9 = iDynTree::Link::getIndex(), lVar8 != lVar9)) {
        iDynTree::Model::getNeighbor((long)model,(uint)lVar3);
        plVar10 = (long *)iDynTree::Model::getJoint((long)model);
        pTVar11 = (Transform *)(**(code **)(*plVar10 + 0x50))(plVar10,jointPos,lVar3,lVar8);
        iDynTree::Transform::Transform((Transform *)&local_c8,pTVar11);
        pWVar7 = (Wrench *)iDynTree::LinkWrenches::operator()(this,lVar3);
        iDynTree::LinkWrenches::operator()(this,lVar8);
        iDynTree::Transform::operator*((Transform *)local_100,&local_c8);
        iDynTree::Wrench::operator+((Wrench *)local_138,pWVar7);
        pWVar7 = (Wrench *)iDynTree::LinkWrenches::operator()(this,lVar3);
        iDynTree::Wrench::operator=(pWVar7,(Wrench *)local_138);
        iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_138);
        iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_100);
      }
    }
  } while (lVar4 != 0);
  pWVar7 = (Wrench *)iDynTree::LinkWrenches::operator()(this,lVar3);
  iDynTree::Wrench::Wrench(__return_storage_ptr__,pWVar7);
  return __return_storage_ptr__;
}

Assistant:

Wrench computeKnownTermsOfEstimationEquationWithoutInternalFT(const Model& model,
                                                              const Traversal& modelTraversal,
                                                              const JointPosDoubleArray & jointPos,
                                                              const LinkVelArray& linkVel,
                                                              const LinkAccArray& linkProperAcc,
                                                                    estimateExternalWrenchesBuffers& bufs)
{
    // First compute the known term of the estimation for each link:
    // this loop is similar to the dynamic phase of the RNEA
    // \todo pimp up performance as done in RNEADynamicPhase
     for(int traversalEl = modelTraversal.getNrOfVisitedLinks()-1; traversalEl >= 0; traversalEl--)
     {
         LinkConstPtr visitedLink = modelTraversal.getLink(traversalEl);
         LinkIndex    visitedLinkIndex = visitedLink->getIndex();
         LinkConstPtr parentLink  = modelTraversal.getParentLink(traversalEl);

         const iDynTree::SpatialInertia & I = visitedLink->getInertia();
         const iDynTree::SpatialAcc     & properAcc = linkProperAcc(visitedLinkIndex);
         const iDynTree::Twist          & v = linkVel(visitedLinkIndex);
         bufs.b_contacts_subtree(visitedLinkIndex) = I*properAcc + v*(I*v);

         // Iterate on childs of visitedLink
         // We obtain all the children as all the neighbors of the link, except
         // for its parent
         // \todo TODO this point is definitly Tree-specific
         // \todo TODO this "get child" for is duplicated in the code, we
         //            should try to consolidate it
         for(unsigned int neigh_i=0; neigh_i < model.getNrOfNeighbors(visitedLinkIndex); neigh_i++)
         {
             LinkIndex neighborIndex = model.getNeighbor(visitedLinkIndex,neigh_i).neighborLink;
             if( !parentLink || neighborIndex != parentLink->getIndex() )
             {
                 LinkIndex childIndex = neighborIndex;
                 IJointConstPtr neighborJoint = model.getJoint(model.getNeighbor(visitedLinkIndex,neigh_i).neighborJoint);
                 Transform visitedLink_X_child = neighborJoint->getTransform(jointPos,visitedLinkIndex,childIndex);

                 // One term of the sum in Equation 5.20 in Featherstone 2008
                 bufs.b_contacts_subtree(visitedLinkIndex) = bufs.b_contacts_subtree(visitedLinkIndex)
                                                            + visitedLink_X_child*bufs.b_contacts_subtree(childIndex);
             }
         }

         if( parentLink == 0 )
         {
             // If the visited link is the base of the submodel, the
             // computed known terms is the known term of the submodel itself
             return bufs.b_contacts_subtree(visitedLinkIndex);
         }
     }

     assert(false);
     return Wrench::Zero();
}